

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_system_matrix.cc
# Opt level: O0

tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
* projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow
            (tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             *__return_storage_ptr__,shared_ptr<const_lf::mesh::Mesh> *mesh,DofHandler *dofh,
            function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
            *f,function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)>
               *dirichlet_data,double sigma,QuadRule *quadrule,bool modified_penalty)

{
  Entity *e;
  bool bVar1;
  int iVar2;
  size_type num_rows;
  size_type num_cols;
  uint uVar3;
  uint blockCols;
  element_type *peVar4;
  undefined4 extraout_var;
  reference ppEVar5;
  Matrix<double,_2,_1,_0,_2,_1> *this;
  undefined1 local_3b0 [8];
  anon_class_16_2_b3f1b856 selector;
  SparseMatrix<double,_0,_int> local_368;
  Type local_320;
  Product<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,__1,__1,_false>,_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
  local_2f0;
  SparseMatrix<double,_0,_int> local_288;
  undefined1 local_240 [8];
  VectorXd offset_function;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  local_200;
  undefined1 local_1e0 [8];
  PiecewiseConstElementVectorProvider elem_vec_builder;
  undefined1 local_160 [8];
  VectorXd rhs;
  PiecewiseConstElementMatrixProvider elem_mat_builder;
  COOMatrix<double> A;
  Entity *ep;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  shared_ptr<const_lf::mesh::Mesh> local_c8;
  undefined1 local_b8 [8];
  CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> dirichlet;
  AllCodimMeshDataSet<bool> boundary;
  bool modified_penalty_local;
  QuadRule *quadrule_local;
  double sigma_local;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> *dirichlet_data_local;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  *f_local;
  DofHandler *dofh_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_local;
  
  lf::mesh::utils::flagEntitiesOnBoundary((AllCodimMeshDataSet<bool> *)&dirichlet.codim_,mesh);
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&local_c8,mesh);
  lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::CodimMeshDataSet
            ((CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_b8,&local_c8,1);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_c8);
  peVar4 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh);
  iVar2 = (*peVar4->_vptr_Mesh[2])(peVar4,1);
  __begin2._M_current = (Entity **)CONCAT44(extraout_var,iVar2);
  __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  ep = (Entity *)
       std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                 ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&ep);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar5 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end2);
    e = *ppEVar5;
    std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)>::operator()
              ((function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> *)
               &A.triplets_.
                super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Entity *)dirichlet_data);
    this = lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator()
                     ((CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_b8,e);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
              (this,(Matrix<double,_2,_1,_0,_2,_1> *)
                    &A.triplets_.
                     super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2);
  }
  num_rows = (*dofh->_vptr_DofHandler[2])();
  num_cols = (*dofh->_vptr_DofHandler[2])();
  lf::assemble::COOMatrix<double>::COOMatrix
            ((COOMatrix<double> *)&elem_mat_builder.modified_,num_rows,num_cols);
  PiecewiseConstElementMatrixProvider::PiecewiseConstElementMatrixProvider
            ((PiecewiseConstElementMatrixProvider *)
             &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             sigma,(MeshDataSet<bool> *)&dirichlet.codim_,modified_penalty);
  lf::assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_const_projects::ipdg_stokes::assemble::PiecewiseConstElementMatrixProvider>
            (0,dofh,dofh,
             (PiecewiseConstElementMatrixProvider *)
             &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (COOMatrix<double> *)&elem_mat_builder.modified_);
  uVar3 = (*dofh->_vptr_DofHandler[2])();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&elem_vec_builder.dirichlet_data_,(ulong)uVar3);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_160,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&elem_vec_builder.dirichlet_data_);
  std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  ::function(&local_200,f);
  lf::quad::QuadRule::QuadRule
            ((QuadRule *)
             &offset_function.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows,quadrule);
  PiecewiseConstElementVectorProvider::PiecewiseConstElementVectorProvider
            ((PiecewiseConstElementVectorProvider *)local_1e0,sigma,&local_200,
             (QuadRule *)
             &offset_function.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows,(MeshDataSet<bool> *)&dirichlet.codim_,
             (MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_b8);
  lf::quad::QuadRule::~QuadRule
            ((QuadRule *)
             &offset_function.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows);
  std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  ::~function(&local_200);
  lf::assemble::
  AssembleVectorLocally<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_projects::ipdg_stokes::assemble::PiecewiseConstElementVectorProvider>
            (0,dofh,(PiecewiseConstElementVectorProvider *)local_1e0,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_160);
  lf::assemble::COOMatrix<double>::makeSparse
            (&local_288,(COOMatrix<double> *)&elem_mat_builder.modified_);
  createOffsetFunction
            ((assemble *)local_240,mesh,(MeshDataSet<bool> *)&dirichlet.codim_,dofh,dirichlet_data,
             &local_288);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix(&local_288);
  lf::assemble::COOMatrix<double>::makeSparse
            (&local_368,(COOMatrix<double> *)&elem_mat_builder.modified_);
  uVar3 = (*dofh->_vptr_DofHandler[2])();
  peVar4 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh);
  blockCols = (*peVar4->_vptr_Mesh[3])(peVar4,2);
  Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::block<unsigned_int,unsigned_int>
            (&local_320,&local_368,0,0,uVar3,blockCols);
  peVar4 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh);
  uVar3 = (*peVar4->_vptr_Mesh[3])(peVar4,2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<unsigned_int>
            ((Type *)&selector.boundary,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_240,uVar3);
  Eigen::SparseMatrixBase<Eigen::Block<Eigen::SparseMatrix<double,0,int>,-1,-1,false>>::operator*
            (&local_2f0,
             (SparseMatrixBase<Eigen::Block<Eigen::SparseMatrix<double,0,int>,_1,_1,false>> *)
             &local_320,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
              *)&selector.boundary);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
            ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_160,
             (MatrixBase<Eigen::Product<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,__1,__1,_false>,_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>_>
              *)&local_2f0);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix(&local_368);
  selector.dofh = (DofHandler *)&dirichlet.codim_;
  local_3b0 = (undefined1  [8])dofh;
  lf::assemble::
  FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((anon_class_16_2_b3f1b856 *)local_3b0,(COOMatrix<double> *)&elem_mat_builder.modified_,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_160);
  std::
  tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::
  tuple<lf::assemble::COOMatrix<double>_&,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_&,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_&,_true,_true>
            (__return_storage_ptr__,(COOMatrix<double> *)&elem_mat_builder.modified_,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_160,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_240);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_240);
  PiecewiseConstElementVectorProvider::~PiecewiseConstElementVectorProvider
            ((PiecewiseConstElementVectorProvider *)local_1e0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_160);
  lf::assemble::COOMatrix<double>::~COOMatrix((COOMatrix<double> *)&elem_mat_builder.modified_);
  lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CodimMeshDataSet
            ((CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_b8);
  lf::mesh::utils::AllCodimMeshDataSet<bool>::~AllCodimMeshDataSet
            ((AllCodimMeshDataSet<bool> *)&dirichlet.codim_);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<lf::assemble::COOMatrix<double>, Eigen::VectorXd, Eigen::VectorXd>
buildSystemMatrixInOutFlow(
    const std::shared_ptr<const lf::mesh::Mesh> &mesh,
    const lf::assemble::DofHandler &dofh,
    const std::function<Eigen::Vector2d(const Eigen::Vector2d &)> &f,
    const std::function<Eigen::Vector2d(const lf::mesh::Entity &)>
        &dirichlet_data,
    double sigma, const lf::quad::QuadRule &quadrule, bool modified_penalty) {
  // Compute the boundary elements
  const auto boundary = lf::mesh::utils::flagEntitiesOnBoundary(mesh);
  // Compute the dirichlet data
  auto dirichlet = lf::mesh::utils::CodimMeshDataSet<Eigen::Vector2d>(mesh, 1);
  for (const auto *ep : mesh->Entities(1)) {
    dirichlet(*ep) = dirichlet_data(*ep);
  }
  // Assemble the system matrix
  lf::assemble::COOMatrix<double> A(dofh.NumDofs(), dofh.NumDofs());
  const auto elem_mat_builder =
      projects::ipdg_stokes::assemble::PiecewiseConstElementMatrixProvider(
          sigma, boundary, modified_penalty);
  lf::assemble::AssembleMatrixLocally(0, dofh, dofh, elem_mat_builder, A);
  // Assemble the right hand side
  Eigen::VectorXd rhs = Eigen::VectorXd::Zero(dofh.NumDofs());
  const auto elem_vec_builder =
      projects::ipdg_stokes::assemble::PiecewiseConstElementVectorProvider(
          sigma, f, quadrule, boundary, dirichlet);
  lf::assemble::AssembleVectorLocally(0, dofh, elem_vec_builder, rhs);

  // Compute the offset function
  const Eigen::VectorXd offset_function = createOffsetFunction(
      mesh, boundary, dofh, dirichlet_data, A.makeSparse());

  // Apply offset function technique to the LSE
  rhs -= A.makeSparse().block(0, 0, dofh.NumDofs(), mesh->NumEntities(2)) *
         offset_function.head(mesh->NumEntities(2));
  auto selector = [&](lf::base::size_type idx) -> std::pair<bool, double> {
    const auto &e = dofh.Entity(idx);
    return {e.RefEl() == lf::base::RefElType::kPoint && boundary(e), 0};
  };
  lf::assemble::FixFlaggedSolutionComponents(selector, A, rhs);

  // Return the computed LSE
  return {A, rhs, offset_function};
}